

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O0

void deqp::egl::Image::initializeStencilRbo(Functions *gl,GLuint rbo,Texture2D *ref)

{
  glScissorFunc p_Var1;
  deUint32 dVar2;
  GLenum GVar3;
  deBool dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ConstPixelBufferAccess *this;
  TextureFormat *baseFormat;
  int *piVar9;
  PixelBufferAccess *pPVar10;
  PixelBufferAccess local_78;
  Vector<int,_2> local_50;
  IVec2 size;
  deUint32 stencil;
  int ndx;
  deUint32 stencilMask;
  Vector<int,_4> local_34;
  int local_24;
  Texture2D *pTStack_20;
  deUint32 numStencilBits;
  Texture2D *ref_local;
  Functions *pFStack_10;
  GLuint rbo_local;
  Functions *gl_local;
  
  pTStack_20 = ref;
  ref_local._4_4_ = rbo;
  pFStack_10 = gl;
  this = &tcu::TextureLevelPyramid::getLevel(&ref->super_TextureLevelPyramid,0)->
          super_ConstPixelBufferAccess;
  baseFormat = tcu::ConstPixelBufferAccess::getFormat(this);
  _ndx = tcu::getEffectiveDepthStencilTextureFormat(baseFormat,MODE_STENCIL);
  tcu::getTextureFormatBitDepth((tcu *)&local_34,(TextureFormat *)&ndx);
  piVar9 = tcu::Vector<int,_4>::x(&local_34);
  local_24 = *piVar9;
  dVar2 = deBitMask32(0,local_24);
  do {
    (*pFStack_10->framebufferRenderbuffer)(0x8d40,0x8d20,0x8d41,ref_local._4_4_);
    GVar3 = (*pFStack_10->getError)();
    glu::checkError(GVar3,
                    "framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, rbo)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x16d);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    (*pFStack_10->clearStencil)(0);
    GVar3 = (*pFStack_10->getError)();
    glu::checkError(GVar3,"clearStencil(0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x16e);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    (*pFStack_10->clear)(0x400);
    GVar3 = (*pFStack_10->getError)();
    glu::checkError(GVar3,"clear(GL_STENCIL_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x16f);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  pPVar10 = tcu::TextureLevelPyramid::getLevel(&pTStack_20->super_TextureLevelPyramid,0);
  tcu::clearStencil(pPVar10,0);
  do {
    (*pFStack_10->enable)(0xc11);
    GVar3 = (*pFStack_10->getError)();
    glu::checkError(GVar3,"enable(GL_SCISSOR_TEST)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x173);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  for (size.m_data[1] = 0; size.m_data[1] < 10; size.m_data[1] = size.m_data[1] + 1) {
    size.m_data[0] = initializeStencilRbo::stencilValues[size.m_data[1]] & dVar2;
    iVar5 = 10 - size.m_data[1];
    iVar6 = tcu::Texture2D::getWidth(pTStack_20);
    iVar7 = 10 - size.m_data[1];
    iVar8 = tcu::Texture2D::getHeight(pTStack_20);
    tcu::Vector<int,_2>::Vector
              (&local_50,(int)((float)iVar5 * ((float)iVar6 / 10.0)),
               (int)((float)iVar7 * ((float)iVar8 / 14.0)));
    iVar5 = tcu::Vector<int,_2>::x(&local_50);
    if ((iVar5 == 0) || (iVar5 = tcu::Vector<int,_2>::y(&local_50), iVar5 == 0)) break;
    do {
      p_Var1 = pFStack_10->scissor;
      iVar5 = tcu::Vector<int,_2>::x(&local_50);
      iVar6 = tcu::Vector<int,_2>::y(&local_50);
      (*p_Var1)(0,0,iVar5,iVar6);
      GVar3 = (*pFStack_10->getError)();
      glu::checkError(GVar3,"scissor(0, 0, size.x(), size.y())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                      ,0x17d);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      (*pFStack_10->clearStencil)(size.m_data[0]);
      GVar3 = (*pFStack_10->getError)();
      glu::checkError(GVar3,"clearStencil(stencil)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                      ,0x17e);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      (*pFStack_10->clear)(0x400);
      GVar3 = (*pFStack_10->getError)();
      glu::checkError(GVar3,"clear(GL_STENCIL_BUFFER_BIT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                      ,0x17f);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    pPVar10 = tcu::TextureLevelPyramid::getLevel(&pTStack_20->super_TextureLevelPyramid,0);
    iVar5 = tcu::Vector<int,_2>::x(&local_50);
    iVar6 = tcu::Vector<int,_2>::y(&local_50);
    tcu::getSubregion(&local_78,pPVar10,0,0,iVar5,iVar6);
    tcu::clearStencil(&local_78,size.m_data[0]);
  }
  do {
    (*pFStack_10->disable)(0xc11);
    GVar3 = (*pFStack_10->getError)();
    glu::checkError(GVar3,"disable(GL_SCISSOR_TEST)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x184);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    (*pFStack_10->framebufferRenderbuffer)(0x8d40,0x8d20,0x8d41,0);
    GVar3 = (*pFStack_10->getError)();
    glu::checkError(GVar3,
                    "framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, 0)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x186);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  return;
}

Assistant:

void initializeStencilRbo(const glw::Functions& gl, GLuint rbo, Texture2D& ref)
{
	static const deUint32 stencilValues[] =
	{
		0xBF688C11u,
		0xB43D2922u,
		0x055D5FFBu,
		0x9300655Eu,
		0x63BE0DF2u,
		0x0345C13Bu,
		0x1C184832u,
		0xD107040Fu,
		0x9B91569Fu,
		0x0F0CFDC7u,
	};

	const deUint32 numStencilBits	= tcu::getTextureFormatBitDepth(tcu::getEffectiveDepthStencilTextureFormat(ref.getLevel(0).getFormat(), tcu::Sampler::MODE_STENCIL)).x();
	const deUint32 stencilMask		= deBitMask32(0, numStencilBits);

	GLU_CHECK_GLW_CALL(gl, framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT,
												   GL_RENDERBUFFER, rbo));
	GLU_CHECK_GLW_CALL(gl, clearStencil(0));
	GLU_CHECK_GLW_CALL(gl, clear(GL_STENCIL_BUFFER_BIT));
	tcu::clearStencil(ref.getLevel(0), 0);

	// create a pattern
	GLU_CHECK_GLW_CALL(gl, enable(GL_SCISSOR_TEST));
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(stencilValues); ++ndx)
	{
		const deUint32		stencil	= stencilValues[ndx] & stencilMask;
		const tcu::IVec2	size	= tcu::IVec2((int)((float)(DE_LENGTH_OF_ARRAY(stencilValues) - ndx) * ((float)ref.getWidth() / float(DE_LENGTH_OF_ARRAY(stencilValues)))),
												 (int)((float)(DE_LENGTH_OF_ARRAY(stencilValues) - ndx) * ((float)ref.getHeight() / float(DE_LENGTH_OF_ARRAY(stencilValues) + 4)))); // not symmetric

		if (size.x() == 0 || size.y() == 0)
			break;

		GLU_CHECK_GLW_CALL(gl, scissor(0, 0, size.x(), size.y()));
		GLU_CHECK_GLW_CALL(gl, clearStencil(stencil));
		GLU_CHECK_GLW_CALL(gl, clear(GL_STENCIL_BUFFER_BIT));

		tcu::clearStencil(tcu::getSubregion(ref.getLevel(0), 0, 0, size.x(), size.y()), stencil);
	}

	GLU_CHECK_GLW_CALL(gl, disable(GL_SCISSOR_TEST));
	GLU_CHECK_GLW_CALL(gl, framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT,
												   GL_RENDERBUFFER, 0));
}